

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_statements.cpp
# Opt level: O2

NamedBlockClauseSyntax * __thiscall slang::parsing::Parser::parseNamedBlockClause(Parser *this)

{
  bool bVar1;
  NamedBlockClauseSyntax *pNVar2;
  Token colon;
  Token local_28;
  
  bVar1 = ParserBase::peek(&this->super_ParserBase,Colon);
  if (bVar1) {
    colon = ParserBase::consume(&this->super_ParserBase);
    Token::Token(&local_28);
    bVar1 = ParserBase::peek(&this->super_ParserBase,NewKeyword);
    if (bVar1) {
      local_28 = ParserBase::consume(&this->super_ParserBase);
    }
    else {
      local_28 = ParserBase::expect(&this->super_ParserBase,Identifier);
    }
    pNVar2 = slang::syntax::SyntaxFactory::namedBlockClause(&this->factory,colon,local_28);
  }
  else {
    pNVar2 = (NamedBlockClauseSyntax *)0x0;
  }
  return pNVar2;
}

Assistant:

NamedBlockClauseSyntax* Parser::parseNamedBlockClause() {
    if (peek(TokenKind::Colon)) {
        auto colon = consume();

        // allow the new keyword here to end constructor declarations
        Token name;
        if (peek(TokenKind::NewKeyword))
            name = consume();
        else
            name = expect(TokenKind::Identifier);

        return &factory.namedBlockClause(colon, name);
    }
    return nullptr;
}